

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_rg_etc1.cpp
# Opt level: O0

color_quad_u8 __thiscall
crnlib::rg_etc1::etc1_solution_coordinates::get_scaled_color(etc1_solution_coordinates *this)

{
  color_quad_u8 *in_RDI;
  int bb;
  int bg;
  int br;
  
  color_quad_u8::color_quad_u8
            (in_RDI,(parameter_t)((ulong)in_RDI >> 0x20),(parameter_t)in_RDI,0,0x22cf9c);
  return (color_quad_u8)SUB84(in_RDI,0);
}

Assistant:

inline color_quad_u8 get_scaled_color() const {
    int br, bg, bb;
    if (m_color4) {
      br = m_unscaled_color.r | (m_unscaled_color.r << 4);
      bg = m_unscaled_color.g | (m_unscaled_color.g << 4);
      bb = m_unscaled_color.b | (m_unscaled_color.b << 4);
    } else {
      br = (m_unscaled_color.r >> 2) | (m_unscaled_color.r << 3);
      bg = (m_unscaled_color.g >> 2) | (m_unscaled_color.g << 3);
      bb = (m_unscaled_color.b >> 2) | (m_unscaled_color.b << 3);
    }
    return color_quad_u8(br, bg, bb);
  }